

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Data>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  SegmentReader *segment;
  uint defaultSize_00;
  ArrayPtr<const_unsigned_char> AVar1;
  WirePointer *local_50;
  ThrowOverflow local_39;
  WirePointer *local_38;
  WirePointer *ref;
  void *pvStack_28;
  ByteCount defaultSize_local;
  void *defaultValue_local;
  PointerReader *this_local;
  
  if (this->pointer == (WirePointer *)0x0) {
    local_50 = (WirePointer *)&(anonymous_namespace)::zero;
  }
  else {
    local_50 = this->pointer;
  }
  local_38 = local_50;
  segment = this->segment;
  ref._4_4_ = defaultSize;
  pvStack_28 = defaultValue;
  defaultValue_local = this;
  defaultSize_00 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(defaultSize,&local_39);
  AVar1 = (ArrayPtr<const_unsigned_char>)
          WireHelpers::readDataPointer(segment,local_50,defaultValue,defaultSize_00);
  return (Reader)AVar1;
}

Assistant:

Data::Reader PointerReader::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readDataPointer(segment, ref, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}